

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

DdNode * cuddDynamicAllocNode(DdManager *table)

{
  _func_void_long *p_Var1;
  DdNode *pDVar2;
  unsigned_long offset;
  DD_OOMFP saveHandler;
  DdNode *node;
  DdNode *list;
  DdNodePtr *mem;
  int i;
  DdManager *table_local;
  
  p_Var1 = Extra_UtilMMoutOfMemory;
  if (table->nextFree == (DdNode *)0x0) {
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    list = (DdNode *)malloc(0xa000);
    Extra_UtilMMoutOfMemory = p_Var1;
    if ((list == (DdNode *)0x0) && (table->stash != (char *)0x0)) {
      if (table->stash != (char *)0x0) {
        free(table->stash);
        table->stash = (char *)0x0;
      }
      table->stash = (char *)0x0;
      table->maxCacheHard = table->cacheSlots - 1;
      table->cacheSlack = -(table->cacheSlots + 1);
      for (mem._4_4_ = 0; mem._4_4_ < table->size; mem._4_4_ = mem._4_4_ + 1) {
        table->subtables[mem._4_4_].maxKeys = table->subtables[mem._4_4_].maxKeys << 2;
      }
      list = (DdNode *)malloc(0xa000);
    }
    if (list == (DdNode *)0x0) {
      (*Extra_UtilMMoutOfMemory)(0x9fd8);
      table->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    table->memused = table->memused + 0x9fd8;
    *(DdNode ***)list = table->memoryList;
    table->memoryList = (DdNode **)list;
    pDVar2 = (DdNode *)((long)&list->index + (0x20 - ((ulong)list & 0x1f) & 0xfffffffffffffff8));
    mem._4_4_ = 1;
    do {
      pDVar2[mem._4_4_ + -1].ref = 0;
      pDVar2[mem._4_4_ + -1].next = pDVar2 + mem._4_4_;
      mem._4_4_ = mem._4_4_ + 1;
    } while (mem._4_4_ < 0x3fe);
    pDVar2[0x3fd].ref = 0;
    pDVar2[0x3fd].next = (DdNode *)0x0;
    table->nextFree = pDVar2;
  }
  pDVar2 = table->nextFree;
  table->nextFree = pDVar2->next;
  return pDVar2;
}

Assistant:

DdNode *
cuddDynamicAllocNode(
  DdManager * table)
{
    int     i;
    DdNodePtr *mem;
    DdNode *list, *node;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (table->nextFree == NULL) {        /* free list is empty */
        /* Try to allocate a new block. */
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
//        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 1);
        mem = (DdNodePtr *) ABC_ALLOC(DdNode, DD_MEM_CHUNK + 2);
        MMoutOfMemory = saveHandler;
        if (mem == NULL && table->stash != NULL) {
            ABC_FREE(table->stash);
            table->stash = NULL;
            /* Inhibit resizing of tables. */
            table->maxCacheHard = table->cacheSlots - 1;
            table->cacheSlack = - (int) (table->cacheSlots + 1);
            for (i = 0; i < table->size; i++) {
                table->subtables[i].maxKeys <<= 2;
            }
//            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
        }
        if (mem == NULL) {
            /* Out of luck. Call the default handler to do
            ** whatever it specifies for a failed malloc.  If this
            ** handler returns, then set error code, print
            ** warning, and return. */
            (*MMoutOfMemory)(sizeof(DdNode)*(DD_MEM_CHUNK + 1));
            table->errorCode = CUDD_MEMORY_OUT;
#ifdef DD_VERBOSE
            (void) fprintf(table->err,
                           "cuddDynamicAllocNode: out of memory");
            (void) fprintf(table->err,"Memory in use = %lu\n",
                           table->memused);
#endif
            return(NULL);
        } else {        /* successful allocation; slice memory */
            unsigned long offset;
            table->memused += (DD_MEM_CHUNK + 1) * sizeof(DdNode);
            mem[0] = (DdNode *) table->memoryList;
            table->memoryList = mem;

            /* Here we rely on the fact that the size of a DdNode is a
            ** power of 2 and a multiple of the size of a pointer.
            ** If we align one node, all the others will be aligned
            ** as well. */
//            offset = (unsigned long) mem & (sizeof(DdNode) - 1);
//            mem += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
            offset = (unsigned long) mem & (32 - 1);
            mem += (32 - offset) / sizeof(DdNodePtr);
#ifdef DD_DEBUG
//            assert(((unsigned long) mem & (sizeof(DdNode) - 1)) == 0);
            assert(((unsigned long) mem & (32 - 1)) == 0);
#endif
            list = (DdNode *) mem;

            i = 1;
            do {
                list[i - 1].ref = 0;
                list[i - 1].next = &list[i];
            } while (++i < DD_MEM_CHUNK);

            list[DD_MEM_CHUNK-1].ref = 0;
            list[DD_MEM_CHUNK - 1].next = NULL;

            table->nextFree = &list[0];
        }
    } /* if free list empty */

    node = table->nextFree;
    table->nextFree = node->next;
    //node->Id = 0;
    return (node);

}